

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cpp
# Opt level: O3

ostream * ccs::operator<<(ostream *os,Dumper *dagDumper)

{
  unordered_set<const_ccs::Node_*,_std::hash<const_ccs::Node_*>,_std::equal_to<const_ccs::Node_*>,_std::allocator<const_ccs::Node_*>_>
  visited;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  _Hashtable<const_ccs::Node_*,_const_ccs::Node_*,_std::allocator<const_ccs::Node_*>,_std::__detail::_Identity,_std::equal_to<const_ccs::Node_*>,_std::hash<const_ccs::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_58;
  Streamer local_20;
  
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  std::__ostream_insert<char,std::char_traits<char>>(os,"digraph {",9);
  std::__ostream_insert<char,std::char_traits<char>>(os,"edge [arrowhead = none]",0x17);
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_20.root = true;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  local_20.style = (Style *)&local_88;
  anon_unknown_1::operator<<(os,&local_20);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_88);
  anon_unknown_1::visit
            (dagDumper,os,
             (unordered_set<const_ccs::Node_*,_std::hash<const_ccs::Node_*>,_std::equal_to<const_ccs::Node_*>,_std::allocator<const_ccs::Node_*>_>
              *)&local_58,dagDumper->node_);
  std::__ostream_insert<char,std::char_traits<char>>(os,"}",1);
  std::
  _Hashtable<const_ccs::Node_*,_const_ccs::Node_*,_std::allocator<const_ccs::Node_*>,_std::__detail::_Identity,_std::equal_to<const_ccs::Node_*>,_std::hash<const_ccs::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_58);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Dumper &dagDumper) {
  std::unordered_set<const Node *> visited;

  os << "digraph {";
  os << "edge [arrowhead = none]";
  os << Streamer(dagDumper.graphStyle(), true);

  visit(dagDumper, os, visited, dagDumper.node_);

  os << "}";

  return os;
}